

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O3

bool __thiscall
HighsLp::userBoundScaleOk(HighsLp *this,HighsInt user_bound_scale,double infinite_bound)

{
  bool bVar1;
  int bound_scale;
  
  bVar1 = true;
  bound_scale = user_bound_scale - this->user_bound_scale_;
  if (bound_scale != 0) {
    bVar1 = boundScaleOk(&this->col_lower_,&this->col_upper_,bound_scale,infinite_bound);
    if (bVar1) {
      bVar1 = boundScaleOk(&this->row_lower_,&this->row_upper_,bound_scale,infinite_bound);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool HighsLp::userBoundScaleOk(const HighsInt user_bound_scale,
                               const double infinite_bound) const {
  const HighsInt dl_user_bound_scale =
      user_bound_scale - this->user_bound_scale_;
  if (!dl_user_bound_scale) return true;
  if (!boundScaleOk(this->col_lower_, this->col_upper_, dl_user_bound_scale,
                    infinite_bound))
    return false;
  return boundScaleOk(this->row_lower_, this->row_upper_, dl_user_bound_scale,
                      infinite_bound);
}